

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O2

double MakeAngleContinuous(double angle,double lastangle)

{
  for (; lastangle + 180.0 < angle; angle = angle + -360.0) {
  }
  for (; angle < lastangle + -180.0; angle = angle + 360.0) {
  }
  return angle;
}

Assistant:

double MakeAngleContinuous(double angle, double lastangle)
{
    while (angle > lastangle + 180.0)
        angle -= 360.0;

    while (angle < lastangle - 180.0)
        angle += 360.0;

    return angle;
}